

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_name
          (Arg *__return_storage_ptr__,BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s
          )

{
  byte bVar1;
  LongLong LVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  Arg *pAVar5;
  FormatError *this_00;
  size_t sVar6;
  char *message;
  BasicStringRef<char> local_28;
  
  local_28.data_ = *s;
  sVar6 = 1;
  do {
    do {
      local_28.size_ = sVar6;
      *s = local_28.data_ + local_28.size_;
      bVar1 = local_28.data_[local_28.size_];
      sVar6 = local_28.size_ + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
  } while ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
  if ((this->super_FormatterBase).next_arg_index_ < 1) {
    (this->super_FormatterBase).next_arg_index_ = -1;
    message = (char *)0x0;
    internal::ArgMap<char>::init(&this->map_,(EVP_PKEY_CTX *)this);
    pAVar5 = internal::ArgMap<char>::find(&this->map_,&local_28);
    if (pAVar5 != (Arg *)0x0) {
      LVar2 = (pAVar5->super_Value).field_0.long_long_value;
      sVar6 = (pAVar5->super_Value).field_0.string.size;
      uVar4 = *(undefined4 *)&pAVar5->field_0x14;
      uVar3 = *(undefined8 *)&pAVar5->field_0x18;
      __return_storage_ptr__->type = pAVar5->type;
      *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar4;
      *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar3;
      (__return_storage_ptr__->super_Value).field_0.long_long_value = LVar2;
      (__return_storage_ptr__->super_Value).field_0.string.size = sVar6;
      goto LAB_0016944a;
    }
    message = "argument not found";
  }
  else {
    message = "cannot switch from automatic to manual argument indexing";
  }
  *(undefined8 *)&__return_storage_ptr__->type = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
  (__return_storage_ptr__->super_Value).field_0.long_long_value = 0;
  (__return_storage_ptr__->super_Value).field_0.string.size = 0;
LAB_0016944a:
  if (message != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this_00,(CStringRef)message);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return __return_storage_ptr__;
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_name(const Char *&s) {
  assert(internal::is_name_start(*s));
  const Char *start = s;
  Char c;
  do {
    c = *++s;
  } while (internal::is_name_start(c) || ('0' <= c && c <= '9'));
  const char *error = 0;
  internal::Arg arg = get_arg(BasicStringRef<Char>(start, s - start), error);
  if (error)
    FMT_THROW(FormatError(error));
  return arg;
}